

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::Mutex::LockWhenCommon(Mutex *this,Condition *cond,KernelTimeout t,bool write)

{
  bool bVar1;
  GraphId id;
  SynchLocksHeld *held_locks;
  undefined7 in_register_00000009;
  undefined1 *how;
  
  how = kSharedS;
  if ((int)CONCAT71(in_register_00000009,write) != 0) {
    how = kExclusiveS;
  }
  id = DebugOnlyDeadlockCheck(this);
  bVar1 = LockSlowWithDeadline(this,(MuHow)how,cond,t,0);
  if (_ZN4absl12lts_2025012712_GLOBAL__N_124synch_deadlock_detectionE_0 != 0) {
    held_locks = Synch_GetAllLocks();
    LockEnter(this,id,held_locks);
  }
  return bVar1;
}

Assistant:

bool Mutex::LockWhenCommon(const Condition& cond,
                           synchronization_internal::KernelTimeout t,
                           bool write) {
  MuHow how = write ? kExclusive : kShared;
  ABSL_TSAN_MUTEX_PRE_LOCK(this, TsanFlags(how));
  GraphId id = DebugOnlyDeadlockCheck(this);
  bool res = LockSlowWithDeadline(how, &cond, t, 0);
  DebugOnlyLockEnter(this, id);
  ABSL_TSAN_MUTEX_POST_LOCK(this, TsanFlags(how), 0);
  return res;
}